

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldMetadata
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor FVar1;
  uint uVar2;
  int iVar3;
  FieldDescriptor *pFVar4;
  ExtensionRange *pEVar5;
  ExtensionRange *pEVar6;
  pointer ppEVar7;
  pointer ppEVar8;
  bool bVar9;
  uint32_t uVar10;
  int iVar11;
  FileOptions_OptimizeMode FVar12;
  FieldGenerator *pFVar13;
  mapped_type *pmVar14;
  Descriptor *pDVar15;
  LogMessage *other;
  long *plVar16;
  undefined8 *puVar17;
  undefined8 uVar18;
  ulong uVar19;
  ulong *puVar20;
  undefined1 *options;
  size_type *psVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  ExtensionRange *range;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar23;
  FieldDescriptor *field;
  long lVar24;
  ExtensionRange **ppEVar25;
  char *pcVar26;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  ExtensionRange **ppEVar27;
  ulong uVar28;
  long lVar29;
  string ptr;
  string serializer;
  uint32_t tag;
  int type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  Formatter format;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  sorted;
  _Alloc_hider local_208;
  size_type local_200;
  FieldDescriptor local_1f8 [8];
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  uint local_190;
  uint local_18c;
  Options *local_188;
  key_type local_180;
  MessageGenerator *local_160;
  string local_158;
  key_type local_138;
  string local_118;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Base_ptr local_d8;
  size_t local_d0;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  local_c8;
  FieldGeneratorMap *local_b0;
  undefined1 local_a8 [56];
  string local_70;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  local_38 = &this->variables_;
  local_a8._0_8_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_a8 + 8),&local_38->_M_t);
  iVar11 = 0;
  if ((this->options_).table_driven_serialization != true) goto LAB_002a3485;
  anon_unknown_0::SortFieldsByNumber(&local_50,this->descriptor_);
  local_188 = &this->options_;
  local_160 = this;
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\x01') {
    Formatter::operator()<>
              ((Formatter *)local_a8,
               "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_), 0, 0, 0, nullptr},\n");
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (ExtensionRange **)0x0;
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (ExtensionRange **)0x0;
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (ExtensionRange **)0x0;
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::reserve(&local_c8,(long)*(int *)(this->descriptor_ + 0x78));
    pDVar15 = this->descriptor_;
    if (0 < *(int *)(pDVar15 + 0x78)) {
      lVar29 = 0;
      lVar24 = 0;
      do {
        local_1c8._0_8_ = *(long *)(pDVar15 + 0x48) + lVar29;
        if (local_c8.
            super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_c8.
            super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor::ExtensionRange_const*>
                    ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                      *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ExtensionRange **)local_1c8);
        }
        else {
          *local_c8.
           super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (ExtensionRange *)local_1c8._0_8_;
          local_c8.
          super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar24 = lVar24 + 1;
        pDVar15 = this->descriptor_;
        lVar29 = lVar29 + 0x10;
      } while (lVar24 < *(int *)(pDVar15 + 0x78));
    }
    ppEVar8 = local_c8.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar7 = local_c8.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_c8.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar29 = (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = lVar29 >> 3;
      lVar24 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar24 == 0; lVar24 = lVar24 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                (local_c8.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_c8.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar29 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (ppEVar7,ppEVar8);
      }
      else {
        ppEVar27 = ppEVar7 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (ppEVar7,ppEVar27);
        for (; ppEVar27 != ppEVar8; ppEVar27 = ppEVar27 + 1) {
          pEVar5 = ppEVar27[-1];
          pEVar6 = *ppEVar27;
          iVar11 = pEVar6->start;
          iVar3 = pEVar5->start;
          ppEVar25 = ppEVar27;
          while (iVar11 < iVar3) {
            *ppEVar25 = pEVar5;
            pEVar5 = ppEVar25[-2];
            ppEVar25 = ppEVar25 + -1;
            iVar3 = pEVar5->start;
          }
          *ppEVar25 = pEVar6;
        }
      }
    }
    local_b0 = &this->field_generators_;
    lVar24 = 0;
    local_190 = 0;
    do {
      uVar19 = (ulong)(int)local_190;
      uVar28 = (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (uVar19 < uVar28) {
        do {
          pEVar5 = local_c8.
                   super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19];
          if (((long)local_50.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_50.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3 != lVar24) &&
             (*(int *)(local_50.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar24] + 4) <= pEVar5->start))
          break;
          Formatter::operator()
                    ((Formatter *)local_a8,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::ExtensionSerializer)},\n"
                     ,&pEVar5->start,&pEVar5->end);
          uVar19 = uVar19 + 1;
          uVar28 = (long)local_c8.
                         super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.
                         super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
        } while (uVar19 < uVar28);
        local_190 = (uint)uVar19;
      }
      if ((long)local_50.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3 == lVar24) goto LAB_002a33d8;
      pFVar4 = local_50.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar24];
      iVar11 = *(int *)(pFVar4 + 4);
      if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
        local_1c8._0_8_ = FieldDescriptor::TypeOnceInit;
        local_f8._0_8_ = pFVar4;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1c8,
                   (FieldDescriptor **)local_f8);
      }
      local_18c = iVar11 << 3 |
                  *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                           (ulong)(byte)pFVar4[2] * 4);
      bVar9 = FieldDescriptor::is_packed(pFVar4);
      if (bVar9) {
        local_18c = *(int *)(pFVar4 + 4) * 8 + 2;
      }
      FieldName_abi_cxx11_((string *)local_f8,(cpp *)pFVar4,field);
      lVar29 = *(long *)(pFVar4 + 0x28);
      if ((lVar29 != 0 && ((byte)pFVar4[1] & 0x10) != 0) &&
         ((*(int *)(lVar29 + 4) != 1 || ((*(byte *)(*(long *)(lVar29 + 0x20) + 1) & 2) == 0)))) {
        std::__cxx11::string::_M_assign((string *)local_f8);
      }
      local_1c8._0_8_ = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"field_name","");
      Formatter::Set<std::__cxx11::string>
                ((Formatter *)local_a8,(string *)local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != local_1b8) {
        operator_delete((void *)local_1c8._0_8_);
      }
      local_208._M_p = (pointer)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"nullptr","");
      if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
        local_1c8._0_8_ = FieldDescriptor::TypeOnceInit;
        local_1e8._0_8_ = pFVar4;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1c8,
                   (FieldDescriptor **)local_1e8);
      }
      options = FieldDescriptor::kTypeToCppTypeMap;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar4[2] * 4) == 10) {
        pDVar15 = FieldDescriptor::message_type(pFVar4);
        if (*(char *)(*(long *)(pDVar15 + 0x20) + 0x4b) != '\x01') {
          pDVar15 = FieldDescriptor::message_type(pFVar4);
          if (*(char *)(*(long *)(pDVar15 + 0x20) + 0x48) != '\0') goto LAB_002a3020;
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"TableStruct","");
          pDVar15 = FieldDescriptor::message_type(pFVar4);
          UniqueName(&local_70,&local_158,(string *)**(undefined8 **)(pDVar15 + 0x10),local_188);
          plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x40eef8);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          psVar21 = (size_type *)(plVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar21) {
            local_118.field_2._M_allocated_capacity = *psVar21;
            local_118.field_2._8_8_ = plVar16[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar21;
            local_118._M_dataplus._M_p = (pointer)*plVar16;
          }
          local_118._M_string_length = plVar16[1];
          *plVar16 = (long)psVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          puVar20 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar20) {
            local_180.field_2._M_allocated_capacity = *puVar20;
            local_180.field_2._8_8_ = puVar17[3];
          }
          else {
            local_180.field_2._M_allocated_capacity = *puVar20;
            local_180._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_180._M_string_length = puVar17[1];
          *puVar17 = puVar20;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          FieldDescriptor::message_type(pFVar4);
          iVar11 = anon_unknown_0::FindMessageIndexInFile
                             ((Descriptor *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          local_1c8._0_8_ = local_1b8;
          local_1c8._8_8_ = FastInt32ToBufferLeft(iVar11,local_1b8[0]._M_local_buf);
          local_1c8._8_8_ = local_1c8._8_8_ + -(long)local_1b8;
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_138,local_1c8._0_8_,
                     (char *)(local_1c8._8_8_ + local_1c8._0_8_));
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            uVar18 = local_180.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_138._M_string_length + local_180._M_string_length) {
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              uVar18 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_138._M_string_length + local_180._M_string_length)
            goto LAB_002a2f15;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_138,0,(char *)0x0,(ulong)local_180._M_dataplus._M_p);
          }
          else {
LAB_002a2f15:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_138._M_dataplus._M_p);
          }
          local_1e8._0_8_ = local_1e8 + 0x10;
          pFVar23 = (FieldDescriptor *)(puVar17 + 2);
          if ((FieldDescriptor *)*puVar17 == pFVar23) {
            local_1d8._M_allocated_capacity = *(undefined8 *)pFVar23;
            local_1d8._8_8_ = puVar17[3];
          }
          else {
            local_1d8._M_allocated_capacity = *(undefined8 *)pFVar23;
            local_1e8._0_8_ = (FieldDescriptor *)*puVar17;
          }
          local_1e8._8_8_ = puVar17[1];
          *puVar17 = pFVar23;
          puVar17[1] = 0;
          *pFVar23 = (FieldDescriptor)0x0;
          std::__cxx11::string::operator=((string *)&local_208,(string *)local_1e8);
          if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          goto LAB_002a3020;
        }
        FieldDescriptor::message_type(pFVar4);
        iVar11 = anon_unknown_0::FindMessageIndexInFile
                           ((Descriptor *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        local_1e8._0_4_ = iVar11;
        pDVar15 = FieldDescriptor::message_type(pFVar4);
        QualifiedClassName_abi_cxx11_
                  ((string *)local_1c8,(cpp *)pDVar15,(Descriptor *)local_188,(Options *)options);
        Formatter::operator()
                  ((Formatter *)local_a8,
                   "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(static_cast< ::$proto_ns$::internal::SpecialSerializer>(::$proto_ns$::internal::MapFieldSerializer< ::$proto_ns$::internal::MapEntryToMapField<$3$>::MapFieldType, $tablename$::serialization_table>))},\n"
                   ,&local_18c,(int *)local_1e8,(string *)local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._0_8_ != local_1b8) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      else {
LAB_002a3020:
        pFVar13 = FieldGeneratorMap::get(local_b0,pFVar4);
        uVar10 = anon_unknown_0::CalcFieldNum(pFVar13,pFVar4,local_188);
        local_118._M_dataplus._M_p._0_4_ = uVar10;
        bVar9 = IsLazy(pFVar4,local_188,local_160->scc_analyzer_);
        if (bVar9) {
          local_118._M_dataplus._M_p._0_4_ = 0x69;
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"proto_ns","");
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](local_38,&local_180);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e8,"reinterpret_cast<const void*>(::",pmVar14);
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)local_1e8);
          paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 == paVar22) {
            local_1b8[0]._0_8_ = paVar22->_M_allocated_capacity;
            local_1b8[0]._8_8_ = puVar17[3];
            local_1c8._0_8_ = local_1b8;
          }
          else {
            local_1b8[0]._0_8_ = paVar22->_M_allocated_capacity;
            local_1c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar17;
          }
          local_1c8._8_8_ = puVar17[1];
          *puVar17 = paVar22;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_208,(string *)local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != local_1b8) {
            operator_delete((void *)local_1c8._0_8_);
          }
          if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p);
          }
          FVar1 = pFVar4[1];
          bVar9 = ((byte)FVar1 & 0x10) == 0;
          lVar29 = *(long *)(pFVar4 + 0x28);
          if ((lVar29 != 0 && !bVar9) &&
             ((*(int *)(lVar29 + 4) != 1 || ((*(byte *)(*(long *)(lVar29 + 0x20) + 1) & 2) == 0))))
          goto LAB_002a31e3;
          if (((byte)FVar1 & 2) == 0) {
            if ((((byte)FVar1 & 0x60) == 0x20) &&
               (*(char *)(*(long *)(pFVar4 + 0x10) + 0x3a) == '\x02')) {
              if (lVar29 == 0 || bVar9) goto LAB_002a31d2;
            }
            else if (((byte)FVar1 & 0x60) == 0x40) goto LAB_002a31d2;
LAB_002a31e3:
            std::__cxx11::string::append((char *)&local_208);
          }
          else {
LAB_002a31d2:
            if (*(char *)(*(long *)(pFVar4 + 0x38) + 0x4f) == '\x01') goto LAB_002a31e3;
          }
          std::__cxx11::string::append((char *)&local_208);
        }
        if (*(char *)(*(long *)(pFVar4 + 0x38) + 0x4f) == '\x01') {
          Formatter::operator()
                    ((Formatter *)local_a8,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _weak_field_map_), $1$, $1$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n"
                     ,&local_18c);
        }
        else {
          FVar1 = pFVar4[1];
          bVar9 = ((byte)FVar1 & 0x10) == 0;
          lVar29 = *(long *)(pFVar4 + 0x28);
          if ((lVar29 != 0 && !bVar9) &&
             ((*(int *)(lVar29 + 4) != 1 || ((*(byte *)(*(long *)(lVar29 + 0x20) + 1) & 2) == 0))))
          {
            local_1c8._0_8_ = local_1b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"oneofoffset","");
            if (((byte)pFVar4[1] & 0x10) == 0) {
              lVar29 = 0;
            }
            else {
              lVar29 = *(long *)(pFVar4 + 0x28);
            }
            local_1e8._0_8_ =
                 (long)((int)((ulong)(lVar29 - *(long *)(*(long *)(lVar29 + 0x10) + 0x30)) >> 3) *
                       -0x33333333) << 2;
            Formatter::Set<unsigned_long>
                      ((Formatter *)local_a8,(string *)local_1c8,(unsigned_long *)local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_ != local_1b8) {
              operator_delete((void *)local_1c8._0_8_);
            }
            pcVar26 = 
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + $oneofoffset$, $2$, $3$},\n"
            ;
            goto LAB_002a338b;
          }
          if (((byte)FVar1 & 2) == 0) {
            if ((((byte)FVar1 & 0x60) == 0x20) &&
               (*(char *)(*(long *)(pFVar4 + 0x10) + 0x3a) == '\x02')) {
              pcVar26 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
              ;
              if (lVar29 == 0 || bVar9) goto LAB_002a32ff;
            }
            else {
              pcVar26 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
              ;
              if (((byte)FVar1 & 0x60) == 0x40) goto LAB_002a32ff;
            }
          }
          else {
LAB_002a32ff:
            local_1c8._0_8_ = local_1b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"hasbitsoffset","");
            if (((byte)pFVar4[1] & 8) == 0) {
              plVar16 = (long *)(*(long *)(pFVar4 + 0x20) + 0x28);
            }
            else if (*(long *)(pFVar4 + 0x28) == 0) {
              plVar16 = (long *)(*(long *)(pFVar4 + 0x10) + 0x70);
            }
            else {
              plVar16 = (long *)(*(long *)(pFVar4 + 0x28) + 0x50);
            }
            Formatter::Set<int>((Formatter *)local_a8,(string *)local_1c8,
                                (local_160->has_bit_indices_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start +
                                (int)((ulong)((long)pFVar4 - *plVar16) >> 3) * 0x38e38e39);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_ != local_1b8) {
              operator_delete((void *)local_1c8._0_8_);
            }
            pcVar26 = 
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + $hasbitsoffset$, $2$, $3$},\n"
            ;
          }
LAB_002a338b:
          Formatter::operator()
                    ((Formatter *)local_a8,pcVar26,&local_18c,(int *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                    );
        }
      }
      if ((FieldDescriptor *)local_208._M_p != local_1f8) {
        operator_delete(local_208._M_p);
      }
      if ((FieldDescriptor *)local_f8._0_8_ != (FieldDescriptor *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      lVar24 = lVar24 + 1;
    } while( true );
  }
  local_b0 = &this->field_generators_;
  uVar18 = CONCAT71((int7)((ulong)local_b0 >> 8),1);
  lVar24 = 0;
  do {
    local_190 = (uint)uVar18;
    pFVar4 = local_50.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar24];
    pFVar13 = FieldGeneratorMap::get(local_b0,pFVar4);
    iVar11 = *(int *)(pFVar4 + 4);
    if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
      local_1c8._0_8_ = FieldDescriptor::TypeOnceInit;
      local_f8._0_8_ = pFVar4;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1c8,
                 (FieldDescriptor **)local_f8);
    }
    uVar2 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)(byte)pFVar4[2] * 4);
    local_f8._8_4_ = _S_red;
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = local_f8 + 8;
    local_d0 = 0;
    local_d8 = (_Base_ptr)local_e8._8_8_;
    QualifiedClassName_abi_cxx11_
              ((string *)local_1c8,(cpp *)local_160->descriptor_,(Descriptor *)local_188,
               (Options *)0x0);
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"classtype","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)&local_208);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_1c8);
    pFVar23 = extraout_RDX;
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
      pFVar23 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != local_1b8) {
      operator_delete((void *)local_1c8._0_8_);
      pFVar23 = extraout_RDX_01;
    }
    FieldName_abi_cxx11_((string *)local_1c8,(cpp *)pFVar4,pFVar23);
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"field_name","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)&local_208);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_1c8);
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != local_1b8) {
      operator_delete((void *)local_1c8._0_8_);
    }
    local_1c8._0_8_ = local_1b8;
    local_1c8._8_8_ = FastUInt32ToBufferLeft(iVar11 << 3 | uVar2,local_1b8[0]._M_local_buf);
    local_1c8._8_8_ = local_1c8._8_8_ + -(long)local_1b8;
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_1c8._0_8_,(char *)(local_1c8._8_8_ + local_1c8._0_8_));
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"tag","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1e8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_);
    }
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    local_1c8._0_8_ = local_1b8;
    local_1c8._8_8_ = FastInt32ToBufferLeft((int32)lVar24,local_1b8[0]._M_local_buf);
    local_1c8._8_8_ = local_1c8._8_8_ + -(long)local_1b8;
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_1c8._0_8_,(char *)(local_1c8._8_8_ + local_1c8._0_8_));
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"hasbit","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1e8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_);
    }
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    uVar10 = anon_unknown_0::CalcFieldNum(pFVar13,pFVar4,local_188);
    local_1c8._0_8_ = local_1b8;
    local_1c8._8_8_ = FastUInt32ToBufferLeft(uVar10,local_1b8[0]._M_local_buf);
    local_1c8._8_8_ = local_1c8._8_8_ + -(long)local_1b8;
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_1c8._0_8_,(char *)(local_1c8._8_8_ + local_1c8._0_8_));
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"type","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1e8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
    if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_);
    }
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    local_1c8._0_8_ = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"ptr","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1c8);
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x40b55f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != local_1b8) {
      operator_delete((void *)local_1c8._0_8_);
    }
    if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
      local_1c8._0_8_ = FieldDescriptor::TypeOnceInit;
      local_208._M_p = (pointer)pFVar4;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_1c8,
                 (FieldDescriptor **)&local_208);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar4[2] * 4) == 10) {
      pDVar15 = FieldDescriptor::message_type(pFVar4);
      if (*(char *)(*(long *)(pDVar15 + 0x20) + 0x4b) == '\x01') {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_1c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x870);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_1c8,
                           "CHECK failed: !IsMapEntryMessage(field->message_type()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_208,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_1c8);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"TableStruct","");
      pDVar15 = FieldDescriptor::message_type(pFVar4);
      UniqueName(&local_118,&local_70,(string *)**(undefined8 **)(pDVar15 + 0x10),local_188);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x40eef8);
      puVar20 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_180.field_2._M_allocated_capacity = *puVar20;
        local_180.field_2._8_8_ = plVar16[3];
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      }
      else {
        local_180.field_2._M_allocated_capacity = *puVar20;
        local_180._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_180._M_string_length = plVar16[1];
      *plVar16 = (long)puVar20;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
      local_1e8._0_8_ = local_1e8 + 0x10;
      pFVar23 = (FieldDescriptor *)(puVar17 + 2);
      if ((FieldDescriptor *)*puVar17 == pFVar23) {
        local_1d8._M_allocated_capacity = *(undefined8 *)pFVar23;
        local_1d8._8_8_ = puVar17[3];
      }
      else {
        local_1d8._M_allocated_capacity = *(undefined8 *)pFVar23;
        local_1e8._0_8_ = (FieldDescriptor *)*puVar17;
      }
      local_1e8._8_8_ = puVar17[1];
      *puVar17 = pFVar23;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      FieldDescriptor::message_type(pFVar4);
      iVar11 = anon_unknown_0::FindMessageIndexInFile
                         ((Descriptor *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      local_1c8._0_8_ = local_1b8;
      local_1c8._8_8_ = FastInt32ToBufferLeft(iVar11,local_1b8[0]._M_local_buf);
      local_1c8._8_8_ = local_1c8._8_8_ + -(long)local_1b8;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,local_1c8._0_8_,(char *)(local_1c8._8_8_ + local_1c8._0_8_));
      uVar18 = 0xf;
      if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
        uVar18 = local_1d8._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_158._M_string_length + local_1e8._8_8_) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          uVar18 = local_158.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_158._M_string_length + local_1e8._8_8_) goto LAB_002a2781;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,local_1e8._0_8_);
      }
      else {
LAB_002a2781:
        puVar17 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_158._M_dataplus._M_p);
      }
      pFVar4 = (FieldDescriptor *)(puVar17 + 2);
      if ((FieldDescriptor *)*puVar17 == pFVar4) {
        local_1f8 = *(FieldDescriptor (*) [8])pFVar4;
        in_stack_fffffffffffffe10 = *(undefined4 *)(puVar17 + 3);
        in_stack_fffffffffffffe14 = *(undefined4 *)((long)puVar17 + 0x1c);
        local_208._M_p = (pointer)local_1f8;
      }
      else {
        local_1f8 = *(FieldDescriptor (*) [8])pFVar4;
        local_208._M_p = (pointer)*puVar17;
      }
      local_200 = puVar17[1];
      *puVar17 = pFVar4;
      puVar17[1] = 0;
      *pFVar4 = (FieldDescriptor)0x0;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ptr","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_f8,&local_138);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((FieldDescriptor *)local_208._M_p != local_1f8) {
        operator_delete(local_208._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
        operator_delete((void *)local_1e8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    local_1c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_a8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_1c8 + 8),
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_a8 + 8));
    Formatter::AddMap((Formatter *)local_a8,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_f8);
    Formatter::operator()<>
              ((Formatter *)local_a8,
               "{PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, $field_name$_), $tag$,PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, _has_bits_) * 8 + $hasbit$, $type$, $ptr$},\n"
              );
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1c8._0_8_ + 8),
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1c8 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_1c8 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_f8);
    lVar24 = 1;
    uVar18 = 0;
  } while ((local_190 & 1) != 0);
  iVar11 = 2;
  goto LAB_002a3473;
LAB_002a33d8:
  FVar12 = GetOptimizeFor(*(FileDescriptor **)(local_160->descriptor_ + 0x10),local_188,(bool *)0x0)
  ;
  pcVar26 = "UnknownFieldSetSerializer";
  if (FVar12 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    pcVar26 = "UnknownFieldSerializerLite";
  }
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,pcVar26,
             pcVar26 + (ulong)(FVar12 == FileOptions_OptimizeMode_LITE_RUNTIME) + 0x19);
  Formatter::operator()
            ((Formatter *)local_a8,
             "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::$1$)},\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if (local_c8.
      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (ExtensionRange **)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar11 = (int)uVar28 + (int)lVar24 + 2;
LAB_002a3473:
  if (local_50.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002a3485:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_a8 + 8));
  return iVar11;
}

Assistant:

int MessageGenerator::GenerateFieldMetadata(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!options_.table_driven_serialization) {
    return 0;
  }

  std::vector<const FieldDescriptor*> sorted = SortFieldsByNumber(descriptor_);
  if (IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < 2; i++) {
      const FieldDescriptor* field = sorted[i];
      const FieldGenerator& generator = field_generators_.get(field);

      uint32_t tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormat::WireTypeForFieldType(field->type()));

      std::map<std::string, std::string> vars;
      vars["classtype"] = QualifiedClassName(descriptor_, options_);
      vars["field_name"] = FieldName(field);
      vars["tag"] = StrCat(tag);
      vars["hasbit"] = StrCat(i);
      vars["type"] = StrCat(CalcFieldNum(generator, field, options_));
      vars["ptr"] = "nullptr";
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_CHECK(!IsMapEntryMessage(field->message_type()));
        vars["ptr"] =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
      Formatter::SaveState saver(&format);
      format.AddMap(vars);
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, $field_name$_), $tag$,"
          "PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, _has_bits_) * 8 + $hasbit$, $type$, "
          "$ptr$},\n");
    }
    return 2;
  }
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_),"
      " 0, 0, 0, nullptr},\n");
  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  sorted_extensions.reserve(descriptor_->extension_range_count());
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  for (int i = 0, extension_idx = 0; /* no range */; i++) {
    for (; extension_idx < sorted_extensions.size() &&
           (i == sorted.size() ||
            sorted_extensions[extension_idx]->start < sorted[i]->number());
         extension_idx++) {
      const Descriptor::ExtensionRange* range =
          sorted_extensions[extension_idx];
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), "
          "$1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::ExtensionSerializer)},\n",
          range->start, range->end);
    }
    if (i == sorted.size()) break;
    const FieldDescriptor* field = sorted[i];

    uint32_t tag = internal::WireFormatLite::MakeTag(
        field->number(), WireFormat::WireTypeForFieldType(field->type()));
    if (field->is_packed()) {
      tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    }

    std::string classfieldname = FieldName(field);
    if (field->real_containing_oneof()) {
      classfieldname = field->containing_oneof()->name();
    }
    format.Set("field_name", classfieldname);
    std::string ptr = "nullptr";
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsMapEntryMessage(field->message_type())) {
        format(
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, "
            "::$proto_ns$::internal::FieldMetadata::kSpecial, "
            "reinterpret_cast<const void*>(static_cast< "
            "::$proto_ns$::internal::SpecialSerializer>("
            "::$proto_ns$::internal::MapFieldSerializer< "
            "::$proto_ns$::internal::MapEntryToMapField<"
            "$3$>::MapFieldType, "
            "$tablename$::serialization_table>))},\n",
            tag, FindMessageIndexInFile(field->message_type()),
            QualifiedClassName(field->message_type(), options_));
        continue;
      } else if (!field->message_type()->options().message_set_wire_format()) {
        // message_set doesn't have the usual table and we need to
        // dispatch to generated serializer, hence ptr stays zero.
        ptr =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
    }

    const FieldGenerator& generator = field_generators_.get(field);
    int type = CalcFieldNum(generator, field, options_);

    if (IsLazy(field, options_, scc_analyzer_)) {
      type = internal::FieldMetadata::kSpecial;
      ptr = "reinterpret_cast<const void*>(::" + variables_["proto_ns"] +
            "::internal::LazyFieldSerializer";
      if (field->real_containing_oneof()) {
        ptr += "OneOf";
      } else if (!HasHasbit(field)) {
        ptr += "NoPresence";
      }
      ptr += ")";
    }

    if (field->options().weak()) {
      // TODO(gerbens) merge weak fields into ranges
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "$classtype$, _weak_field_map_), $1$, $1$, "
          "::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n",
          tag);
    } else if (field->real_containing_oneof()) {
      format.Set("oneofoffset",
                 sizeof(uint32_t) * field->containing_oneof()->index());
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$,"
          " PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + "
          "$oneofoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else if (HasHasbit(field)) {
      format.Set("hasbitsoffset", has_bit_indices_[field->index()]);
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + "
          "$hasbitsoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else {
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, ~0u, $2$, $3$},\n",
          tag, type, ptr);
    }
  }
  int num_field_metadata = 1 + sorted.size() + sorted_extensions.size();
  num_field_metadata++;
  std::string serializer = UseUnknownFieldSet(descriptor_->file(), options_)
                               ? "UnknownFieldSetSerializer"
                               : "UnknownFieldSerializerLite";
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, "
      "::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const "
      "void*>(::$proto_ns$::internal::$1$)},\n",
      serializer);
  return num_field_metadata;
}